

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cc
# Opt level: O1

void __thiscall flow::MatchHead::MatchHead(MatchHead *this,MatchDef *def,Program *program)

{
  PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *this_00;
  pointer pMVar1;
  pointer pbVar2;
  size_type sVar3;
  pointer pcVar4;
  MatchClass MVar5;
  undefined4 uVar6;
  Node *n;
  MatchCaseDef *one;
  pointer pMVar7;
  size_type sVar8;
  
  (this->super_Match)._vptr_Match = (_func_int **)&PTR__Match_00196c08;
  MVar5 = def->op;
  uVar6 = *(undefined4 *)&def->field_0xc;
  (this->super_Match).def_.handlerId = def->handlerId;
  (this->super_Match).def_.op = MVar5;
  *(undefined4 *)&(this->super_Match).def_.field_0xc = uVar6;
  (this->super_Match).def_.elsePC = def->elsePC;
  std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>::vector
            (&(this->super_Match).def_.cases,&def->cases);
  (this->super_Match)._vptr_Match = (_func_int **)&PTR__MatchHead_00196c58;
  (this->map_).root_.parent = (Node *)0x0;
  (this->map_).root_.element = '\0';
  (this->map_).root_.children._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->map_).root_.children._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->map_).root_.children._M_h._M_rehash_policy = 0;
  (this->map_).root_.children._M_h._M_rehash_policy._M_next_resize = 0;
  (this->map_).root_.children._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->map_).root_.value = 0;
  (this->map_).root_.children._M_h._M_buckets = &(this->map_).root_.children._M_h._M_single_bucket;
  (this->map_).root_.children._M_h._M_bucket_count = 1;
  (this->map_).root_.children._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->map_).root_.children._M_h._M_element_count = 0;
  (this->map_).root_.children._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->map_).root_.children._M_h._M_rehash_policy._M_next_resize = 0;
  (this->map_).root_.children._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pMVar7 = (def->cases).super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (def->cases).super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pMVar7 != pMVar1) {
    this_00 = &this->map_;
    do {
      pbVar2 = (program->cp_).strings_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar3 = pbVar2[pMVar7->label]._M_string_length;
      n = &this_00->root_;
      if (sVar3 != 0) {
        pcVar4 = pbVar2[pMVar7->label]._M_dataplus._M_p;
        sVar8 = 0;
        do {
          n = util::
              PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
              ::acquire(this_00,pcVar4[sVar8],n);
          sVar8 = sVar8 + 1;
        } while (sVar3 != sVar8);
      }
      n->value = pMVar7->pc;
      pMVar7 = pMVar7 + 1;
    } while (pMVar7 != pMVar1);
  }
  return;
}

Assistant:

MatchHead::MatchHead(const MatchDef& def, Program* program)
    : Match(def),
      map_() {
  for (const auto& one : def.cases) {
    map_.insert(program->constants().getString(one.label), one.pc);
  }
}